

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpendableAppearance.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::DATA_TYPE::ExpendableAppearance::operator==
          (ExpendableAppearance *this,ExpendableAppearance *Value)

{
  KUINT32 b;
  KUINT32 a;
  ExpendableAppearance *Value_local;
  ExpendableAppearance *this_local;
  
  return *this == *Value;
}

Assistant:

KBOOL ExpendableAppearance::operator == ( const ExpendableAppearance & Value ) const
{
    // Lets do a single comparison instead of checking every field.
    // This struct is basically a KUINT32 so lets cast it to one and compare.

    KUINT32 a = *( KUINT32 * )this;
    KUINT32 b = *( KUINT32 * )&Value;

    if( a != b )return false;
    return true;
}